

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d80.cpp
# Opt level: O0

bool ReadD80(MemFile *file,shared_ptr<Disk> *disk)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong extraout_RAX;
  ulong uVar4;
  element_type *peVar5;
  Data *data;
  size_t in_RCX;
  char *__stream;
  undefined1 local_168 [8];
  Format fmt;
  uint8_t sectors;
  uint8_t cyls;
  uint8_t heads;
  uint8_t ab [256];
  shared_ptr<Disk> *disk_local;
  MemFile *file_local;
  
  MemFile::rewind(file,(FILE *)disk);
  if (((extraout_RAX & 1) == 0) ||
     (uVar4 = MemFile::read(file,(int)&fmt + 0x38,(void *)0x100,in_RCX), (uVar4 & 1) == 0)) {
    file_local._7_1_ = false;
  }
  else if ((ab._196_4_ == 0x534f4453) && (iVar1 = memcmp(ab + 0xa9,ab + 0xad,3), iVar1 == 0)) {
    fmt.gap3._3_1_ = 1;
    if ((ab[0xa9] & 0x10) != 0) {
      fmt.gap3._3_1_ = 2;
    }
    fmt.gap3._2_1_ = ab[0xaa];
    fmt.gap3._1_1_ = ab[0xab];
    __stream = (char *)0x5;
    Format::Format((Format *)local_168,D80);
    local_168._0_4_ = ZEXT14(fmt.gap3._2_1_);
    local_168._4_4_ = ZEXT14(fmt.gap3._3_1_);
    fmt.datarate = (DataRate)fmt.gap3._1_1_;
    Format::Validate((Format *)local_168);
    if (opt.fix != 0) {
      iVar1 = MemFile::size(file);
      iVar2 = Format::disk_size((Format *)local_168);
      if (iVar1 != iVar2) {
        iVar1 = MemFile::size(file);
        uVar3 = (uint)fmt.gap3._3_1_;
        iVar2 = Format::track_size((Format *)local_168);
        if (iVar1 % (int)(uVar3 * iVar2) == 0) {
          iVar1 = MemFile::size(file);
          uVar3 = (uint)fmt.gap3._3_1_;
          iVar2 = Format::track_size((Format *)local_168);
          local_168._0_4_ = iVar1 / (int)(uVar3 * iVar2) & 0xff;
          __stream = "corrected cylinder count to match disk size";
          Message<>(msgWarning,"corrected cylinder count to match disk size");
        }
      }
    }
    MemFile::rewind(file,(FILE *)__stream);
    peVar5 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)disk)
    ;
    data = MemFile::data(file);
    Disk::format(peVar5,(Format *)local_168,data,false);
    peVar5 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)disk)
    ;
    std::__cxx11::string::operator=((string *)&peVar5->strType,"D80");
    file_local._7_1_ = true;
  }
  else {
    file_local._7_1_ = false;
  }
  return file_local._7_1_;
}

Assistant:

bool ReadD80(MemFile& file, std::shared_ptr<Disk>& disk)
{
    uint8_t ab[256];
    if (!file.rewind() || !file.read(&ab, sizeof(ab)))
        return false;

    // Check the signature and the duplicate geometry block
    if (memcmp(ab + 204, D80_SIGNATURE, sizeof(D80_SIGNATURE) - 1) || memcmp(ab + 177, ab + 181, 3))
        return false;

    uint8_t heads = (ab[177] & 0x10) ? 2 : 1;
    uint8_t cyls = ab[178];
    uint8_t sectors = ab[179];

    Format fmt{ RegularFormat::D80 };
    fmt.cyls = cyls;
    fmt.heads = heads;
    fmt.sectors = sectors;
    fmt.Validate();

    // Allow cylinder count correction if the image size is a multiple of the track size
    if (opt.fix != 0 && file.size() != fmt.disk_size() && !(file.size() % (heads * fmt.track_size())))
    {
        fmt.cyls = static_cast<uint8_t>(file.size() / (heads * fmt.track_size()));
        Message(msgWarning, "corrected cylinder count to match disk size");
    }

    file.rewind();
    disk->format(fmt, file.data());
    disk->strType = "D80";

    return true;
}